

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[13],unsigned_int&,char_const(&)[14],CylHead&>
          (exception *this,char (*args) [13],uint *args_1,char (*args_2) [14],CylHead *args_3)

{
  CylHead *in_R9;
  string local_50;
  CylHead *local_30;
  CylHead *args_local_3;
  char (*args_local_2) [14];
  uint *args_local_1;
  char (*args_local) [13];
  exception *this_local;
  
  local_30 = args_3;
  args_local_3 = (CylHead *)args_2;
  args_local_2 = (char (*) [14])args_1;
  args_local_1 = (uint *)args;
  args_local = (char (*) [13])this;
  make_string<char_const(&)[13],unsigned_int&,char_const(&)[14],CylHead&>
            (&local_50,(util *)args,(char (*) [13])args_1,(uint *)args_2,(char (*) [14])args_3,in_R9
            );
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}